

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_header.cpp
# Opt level: O3

bool __thiscall BamTools::HeaderTool::HeaderToolPrivate::Run(HeaderToolPrivate *this)

{
  char cVar1;
  bool bVar2;
  string *__x;
  istream *piVar3;
  ostream *poVar4;
  HeaderSettings *pHVar5;
  BamMultiReader reader;
  ifstream filelist;
  value_type local_248;
  string local_228 [16];
  
  pHVar5 = this->m_settings;
  if ((pHVar5->HasInput == false) && (pHVar5->HasInputFilelist == false)) {
    __x = Options::StandardIn_abi_cxx11_();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&pHVar5->InputFiles,__x);
    pHVar5 = this->m_settings;
  }
  if (pHVar5->HasInputFilelist == true) {
    std::ifstream::ifstream(local_228,(pHVar5->InputFilelist)._M_dataplus._M_p,_S_in);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "bamtools header ERROR: could not open input BAM file list... Aborting.",0x46);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
      std::ostream::put(' ');
      std::ostream::flush();
      std::ifstream::~ifstream(local_228);
      return false;
    }
    local_248._M_string_length = 0;
    local_248.field_2._M_local_buf[0] = '\0';
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    while( true ) {
      cVar1 = std::ios::widen((char)*(undefined8 *)(local_228[0]._M_dataplus._M_p + -0x18) +
                              (char)local_228);
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_228,(string *)&local_248,cVar1);
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->m_settings->InputFiles,&local_248);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p);
    }
    std::ifstream::~ifstream(local_228);
  }
  BamMultiReader::BamMultiReader((BamMultiReader *)&local_248);
  bVar2 = BamMultiReader::Open((BamMultiReader *)&local_248,&this->m_settings->InputFiles);
  if (bVar2) {
    BamMultiReader::GetHeaderText_abi_cxx11_(local_228,(BamMultiReader *)&local_248);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_228[0]._M_dataplus._M_p,
                        local_228[0]._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228[0]._M_dataplus._M_p != &local_228[0].field_2) {
      operator_delete(local_228[0]._M_dataplus._M_p);
    }
    BamMultiReader::Close((BamMultiReader *)&local_248);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "bamtools header ERROR: could not open BAM file(s) for reading... Aborting.",0x4a);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
  }
  BamMultiReader::~BamMultiReader((BamMultiReader *)&local_248);
  return bVar2;
}

Assistant:

bool HeaderTool::HeaderToolPrivate::Run()
{

    // set to default input if none provided
    if (!m_settings->HasInput && !m_settings->HasInputFilelist)
        m_settings->InputFiles.push_back(Options::StandardIn());

    // add files in the filelist to the input file list
    if (m_settings->HasInputFilelist) {

        std::ifstream filelist(m_settings->InputFilelist.c_str(), std::ios::in);
        if (!filelist.is_open()) {
            std::cerr << "bamtools header ERROR: could not open input BAM file list... Aborting."
                      << std::endl;
            return false;
        }

        std::string line;
        while (std::getline(filelist, line))
            m_settings->InputFiles.push_back(line);
    }

    // attemp to open BAM files
    BamMultiReader reader;
    if (!reader.Open(m_settings->InputFiles)) {
        std::cerr << "bamtools header ERROR: could not open BAM file(s) for reading... Aborting."
                  << std::endl;
        return false;
    }

    // dump (merged) header contents to stdout
    std::cout << reader.GetHeaderText() << std::endl;

    // clean up & exit
    reader.Close();
    return true;
}